

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<float> __thiscall
qclab::dense::operator+(dense *this,SquareMatrix<float> *lhs,SquareMatrix<float> *rhs)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  data_type extraout_RDX;
  long lVar4;
  int64_t i;
  long lVar5;
  SquareMatrix<float> SVar6;
  
  lVar1 = rhs->size_;
  if (lVar1 == lhs->size_) {
    if (0 < lVar1) {
      pfVar2 = (rhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      pfVar3 = (lhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      lVar4 = 0;
      do {
        lVar5 = 0;
        do {
          pfVar3[lVar5] = pfVar2[lVar5] + pfVar3[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
        lVar4 = lVar4 + 1;
        pfVar3 = pfVar3 + lVar1;
        pfVar2 = pfVar2 + lVar1;
      } while (lVar4 != lVar1);
    }
    SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)this,lhs);
    SVar6.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         extraout_RDX._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl;
    SVar6.size_ = (size_type_conflict)this;
    return SVar6;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0x98,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<float>::operator+=(const SquareMatrix<T> &) [T = float]"
               );
}

Assistant:

inline int64_t size() const { return size_ ; }